

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::init
          (LayoutBindingRenderCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderType SVar1;
  TestType TVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  GLint GVar6;
  deBool dVar7;
  int extraout_EAX;
  RenderContext *pRVar8;
  deUint32 extraout_var;
  char *str;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  NotSupportedError *pNVar11;
  undefined4 extraout_var_00;
  TestError *pTVar12;
  undefined8 local_934;
  deUint16 indices [6];
  Vec3 vertices [4];
  allocator<char> local_8e9;
  deUint32 program;
  MessageBuilder local_8c8;
  undefined1 local_742;
  allocator<char> local_741;
  string local_740;
  undefined1 local_71a;
  allocator<char> local_719;
  string local_718;
  undefined1 local_6f2;
  allocator<char> local_6f1;
  string local_6f0;
  undefined1 local_6ca;
  allocator<char> local_6c9;
  string local_6c8;
  undefined1 local_6a2;
  allocator<char> local_6a1;
  string local_6a0;
  undefined1 local_67a;
  allocator<char> local_679;
  string local_678;
  int local_654;
  MessageBuilder local_650;
  MessageBuilder local_4d0;
  MessageBuilder local_350;
  MessageBuilder local_1d0;
  int local_3c;
  int local_38;
  GLint maxUnits;
  GLint maxCombinedUnits;
  GLint maxFragmentUnits;
  GLint maxVertexUnits;
  GLint numBindingPoints;
  Random rnd;
  Functions *gl;
  LayoutBindingRenderCase *this_local;
  
  pRVar8 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar8->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  de::Random::Random((Random *)&maxVertexUnits,dVar4 ^ 0xff23a4);
  maxFragmentUnits = 0;
  maxCombinedUnits = 0;
  maxUnits = 0;
  local_38 = 0;
  local_3c = 0;
  (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxVertexUnitsEnum,&maxCombinedUnits);
  (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxFragmentUnitsEnum,&maxUnits);
  (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxCombinedUnitsEnum,&local_38);
  (**(code **)(rnd.m_rnd._8_8_ + 0x868))(this->m_maxBindingPointEnum,&maxFragmentUnits);
  dVar4 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar4,"Querying available uniform numbers failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x192);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_1d0,
                       (char (*) [54])"Maximum units for uniform type in the vertex shader: ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&maxCombinedUnits);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_350,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_350,
                       (char (*) [56])"Maximum units for uniform type in the fragment shader: ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&maxUnits);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_350);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_4d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_4d0,(char (*) [42])"Maximum combined units for uniform type: ");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_38);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4d0);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_650,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_650,(char (*) [41])"Maximum binding point for uniform type: ");
  local_654 = maxFragmentUnits + -1;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_654);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_650);
  SVar1 = this->m_shaderType;
  if (SVar1 == SHADERTYPE_VERTEX) {
    local_3c = maxCombinedUnits;
  }
  else if (SVar1 == SHADERTYPE_FRAGMENT) {
    local_3c = maxUnits;
  }
  else if (SVar1 == SHADERTYPE_ALL) {
    local_3c = local_38 / 2;
  }
  TVar2 = this->m_testType;
  if (TVar2 < TESTTYPE_BINDING_MULTIPLE) {
    this->m_numBindings = 1;
  }
  else if (TVar2 == TESTTYPE_BINDING_MULTIPLE) {
    if (local_3c < 2) {
      local_67a = 1;
      pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_678,"Not enough uniforms available for test",&local_679);
      tcu::NotSupportedError::NotSupportedError(pNVar11,&local_678);
      local_67a = 0;
      __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    iVar5 = ::deMin32(7,local_3c);
    iVar5 = de::Random::getInt((Random *)&maxVertexUnits,2,iVar5);
    this->m_numBindings = iVar5;
  }
  else if (TVar2 - TESTTYPE_BINDING_ARRAY < 2) {
    if (local_3c < 2) {
      local_6a2 = 1;
      pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a0,"Not enough uniforms available for test",&local_6a1);
      tcu::NotSupportedError::NotSupportedError(pNVar11,&local_6a0);
      local_6a2 = 0;
      __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    iVar5 = ::deMin32(7,local_3c);
    iVar5 = de::Random::getInt((Random *)&maxVertexUnits,2,iVar5);
    this->m_numBindings = iVar5;
  }
  if (((this->m_shaderType == SHADERTYPE_VERTEX) || (this->m_shaderType == SHADERTYPE_ALL)) &&
     (maxCombinedUnits < this->m_numBindings)) {
    local_6ca = 1;
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c8,"Vertex shader: not enough uniforms available for test",
               &local_6c9);
    tcu::NotSupportedError::NotSupportedError(pNVar11,&local_6c8);
    local_6ca = 0;
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (((this->m_shaderType == SHADERTYPE_FRAGMENT) || (this->m_shaderType == SHADERTYPE_ALL)) &&
     (maxUnits < this->m_numBindings)) {
    local_6f2 = 1;
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f0,"Fragment shader: not enough uniforms available for test",
               &local_6f1);
    tcu::NotSupportedError::NotSupportedError(pNVar11,&local_6f0);
    local_6f2 = 0;
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if ((this->m_shaderType == SHADERTYPE_ALL) &&
     (SBORROW4(local_38,this->m_numBindings * 2) != local_38 + this->m_numBindings * -2 < 0)) {
    local_71a = 1;
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_718,"Not enough uniforms available for test",&local_719);
    tcu::NotSupportedError::NotSupportedError(pNVar11,&local_718);
    local_71a = 0;
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (maxFragmentUnits < this->m_numBindings) {
    local_742 = 1;
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,"Not enough binding points available for test",&local_741);
    tcu::NotSupportedError::NotSupportedError(pNVar11,&local_740);
    local_742 = 0;
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initBindingPoints(this,0,maxFragmentUnits);
  de::Random::~Random((Random *)&maxVertexUnits);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_8c8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_8c8,(char (*) [22])"Creating test shaders");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8c8);
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  this->m_program = (ShaderProgram *)CONCAT44(extraout_var_00,iVar5);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar9,this->m_program);
  bVar3 = glu::ShaderProgram::isOk(this->m_program);
  if (bVar3) {
    dVar4 = glu::ShaderProgram::getProgram(this->m_program);
    GVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0x780))(dVar4,"a_position");
    this->m_shaderProgramPosLoc = GVar6;
    GVar6 = (**(code **)(rnd.m_rnd._8_8_ + 0xb48))(dVar4,"u_arrayNdx");
    this->m_shaderProgramArrayNdxLoc = GVar6;
    this->m_vertexBuffer = 0;
    this->m_indexBuffer = 0;
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(indices + 2),-1.0,-1.0,1.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(vertices[0].m_data + 1),1.0,-1.0,1.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(vertices[1].m_data + 1),1.0,1.0,1.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(vertices[2].m_data + 1),-1.0,1.0,1.0);
    local_934 = 0x200010000;
    indices[0] = 2;
    indices[1] = 3;
    while (((dVar7 = ::deGetFalse(), dVar7 == 0 && (-1 < this->m_shaderProgramPosLoc)) &&
           (-1 < this->m_shaderProgramArrayNdxLoc))) {
      dVar7 = ::deGetFalse();
      if (dVar7 == 0) {
        (**(code **)(rnd.m_rnd._8_8_ + 0x6c8))(1,&this->m_indexBuffer);
        (**(code **)(rnd.m_rnd._8_8_ + 0x40))(0x8893,this->m_indexBuffer);
        (**(code **)(rnd.m_rnd._8_8_ + 0x150))(0x8893,0xc,&local_934,0x88e4);
        dVar4 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
        glu::checkError(dVar4,"Index buffer setup failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                        ,0x1fd);
        (**(code **)(rnd.m_rnd._8_8_ + 0x6c8))(1,&this->m_vertexBuffer);
        (**(code **)(rnd.m_rnd._8_8_ + 0x40))(0x8892,this->m_vertexBuffer);
        (**(code **)(rnd.m_rnd._8_8_ + 0x150))(0x8892,0x30,indices + 2,0x88e4);
        (**(code **)(rnd.m_rnd._8_8_ + 0x610))(this->m_shaderProgramPosLoc);
        (**(code **)(rnd.m_rnd._8_8_ + 0x19f0))(this->m_shaderProgramPosLoc,3,0x1406,0,0,0);
        dVar4 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
        glu::checkError(dVar4,"Vertex buffer setup failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                        ,0x205);
        return extraout_EAX;
      }
    }
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,(char *)0x0,
               "(m_shaderProgramPosLoc >= 0) && (m_shaderProgramArrayNdxLoc >= 0)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
               ,0x1f7);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"Shader compile failed",&local_8e9);
  tcu::TestError::TestError(pTVar12,(string *)&program);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void LayoutBindingRenderCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	{
		de::Random				rnd					(deStringHash(getName()) ^ 0xff23a4);
		glw::GLint				numBindingPoints	= 0;	// Number of available binding points
		glw::GLint				maxVertexUnits		= 0;	// Available uniforms in the vertex shader
		glw::GLint				maxFragmentUnits	= 0;	// Available uniforms in the fragment shader
		glw::GLint				maxCombinedUnits	= 0;	// Available uniforms in all the shader stages combined
		glw::GLint				maxUnits			= 0;	// Maximum available uniforms for this test

		gl.getIntegerv(m_maxVertexUnitsEnum, &maxVertexUnits);
		gl.getIntegerv(m_maxFragmentUnitsEnum, &maxFragmentUnits);
		gl.getIntegerv(m_maxCombinedUnitsEnum, &maxCombinedUnits);
		gl.getIntegerv(m_maxBindingPointEnum, &numBindingPoints);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Querying available uniform numbers failed");

		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the vertex shader: " << maxVertexUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum units for uniform type in the fragment shader: " << maxFragmentUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum combined units for uniform type: " << maxCombinedUnits << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Maximum binding point for uniform type: " << numBindingPoints-1 << tcu::TestLog::EndMessage;

		// Select maximum number of uniforms used for the test
		switch (m_shaderType)
		{
			case SHADERTYPE_VERTEX:
				maxUnits = maxVertexUnits;
				break;

			case SHADERTYPE_FRAGMENT:
				maxUnits = maxFragmentUnits;
				break;

			case SHADERTYPE_ALL:
				maxUnits = maxCombinedUnits/2;
				break;

			default:
				DE_ASSERT(false);
		}

		// Select the number of uniforms (= bindings) used for this test
		switch (m_testType)
		{
			case TESTTYPE_BINDING_SINGLE:
			case TESTTYPE_BINDING_MAX:
				m_numBindings = 1;
				break;

			case TESTTYPE_BINDING_MULTIPLE:
				if (maxUnits < 2)
					throw tcu::NotSupportedError("Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_MULTIPLE_INSTANCES, maxUnits));
				break;

			case TESTTYPE_BINDING_ARRAY:
			case TESTTYPE_BINDING_MAX_ARRAY:
				if (maxUnits < 2)
					throw tcu::NotSupportedError("Not enough uniforms available for test");
				m_numBindings = rnd.getInt(2, deMin32(MAX_UNIFORM_ARRAY_SIZE, maxUnits));
				break;

			default:
				DE_ASSERT(false);
		}

		// Check that we have enough uniforms in different shaders to perform the tests
		if ( ((m_shaderType == SHADERTYPE_VERTEX) || (m_shaderType == SHADERTYPE_ALL)) && (maxVertexUnits < m_numBindings) )
			throw tcu::NotSupportedError("Vertex shader: not enough uniforms available for test");
		if ( ((m_shaderType == SHADERTYPE_FRAGMENT) || (m_shaderType == SHADERTYPE_ALL)) && (maxFragmentUnits < m_numBindings) )
			throw tcu::NotSupportedError("Fragment shader: not enough uniforms available for test");
		if ( (m_shaderType == SHADERTYPE_ALL) && (maxCombinedUnits < m_numBindings*2) )
			throw tcu::NotSupportedError("Not enough uniforms available for test");

		// Check that we have enough binding points to perform the tests
		if (numBindingPoints < m_numBindings)
			throw tcu::NotSupportedError("Not enough binding points available for test");

		// Initialize the binding points i.e. populate the two binding point vectors
		initBindingPoints(0, numBindingPoints);
	}

	// Generate the shader program - note: this must be done after deciding the binding points
	DE_ASSERT(!m_program);
	m_testCtx.getLog() << tcu::TestLog::Message << "Creating test shaders" << tcu::TestLog::EndMessage;
	m_program = generateShaders();
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("Shader compile failed");

	// Setup vertex and index buffers
	{
		// Get attribute and uniform locations
		const deUint32	program	= m_program->getProgram();

		m_shaderProgramPosLoc		= gl.getAttribLocation(program, "a_position");
		m_shaderProgramArrayNdxLoc	= gl.getUniformLocation(program, "u_arrayNdx");
		m_vertexBuffer				= 0;
		m_indexBuffer				= 0;

		// Setup buffers so that we render one quad covering the whole viewport
		const Vec3 vertices[] =
		{
			Vec3(-1.0f, -1.0f, +1.0f),
			Vec3(+1.0f, -1.0f, +1.0f),
			Vec3(+1.0f, +1.0f, +1.0f),
			Vec3(-1.0f, +1.0f, +1.0f),
		};

		const deUint16 indices[] =
		{
			0, 1, 2,
			0, 2, 3,
		};

		TCU_CHECK((m_shaderProgramPosLoc >= 0) && (m_shaderProgramArrayNdxLoc >= 0));

		// Generate and bind index buffer
		gl.genBuffers(1, &m_indexBuffer);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (DE_LENGTH_OF_ARRAY(indices)*(glw::GLsizeiptr)sizeof(indices[0])), &indices[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Index buffer setup failed");

		// Generate and bind vertex buffer
		gl.genBuffers(1, &m_vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, (DE_LENGTH_OF_ARRAY(vertices)*(glw::GLsizeiptr)sizeof(vertices[0])), &vertices[0], GL_STATIC_DRAW);
		gl.enableVertexAttribArray(m_shaderProgramPosLoc);
		gl.vertexAttribPointer(m_shaderProgramPosLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Vertex buffer setup failed");
	}
}